

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-multicast.c
# Opt level: O0

int luaopen_multicast_core(lua_State *L)

{
  undefined1 local_a8 [8];
  luaL_Reg l [9];
  lua_State *L_local;
  
  memcpy(local_a8,&DAT_00184b10,0x90);
  luaL_checkversion_(L,503.0,0x88);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,8);
  luaL_setfuncs(L,(luaL_Reg *)local_a8,0);
  return 1;
}

Assistant:

int
luaopen_multicast_core(lua_State *L) {
	luaL_Reg l[] = {
		{ "pack", mc_packlocal },
		{ "unpack", mc_unpacklocal },
		{ "bind", mc_bindrefer },
		{ "close", mc_closelocal },
		{ "remote", mc_remote },
		{ "packstring", mc_packstring },
		{ "packremote", mc_packremote },
		{ "nextid", mc_nextid },
		{ NULL, NULL },
	};
	luaL_checkversion(L);
	luaL_newlib(L,l);
	return 1;
}